

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slacking.hpp
# Opt level: O0

void __thiscall slack::_detail::Session::Session(Session *this,bool throw_exception)

{
  CURL *pCVar1;
  bool throw_exception_local;
  Session *this_local;
  
  std::__cxx11::string::string((string *)&this->url_);
  std::__cxx11::string::string((string *)&this->proxy_url_);
  std::__cxx11::string::string((string *)&this->token_);
  this->throw_exception_ = throw_exception;
  std::mutex::mutex(&this->mutex_request_);
  curl_global_init(3);
  pCVar1 = (CURL *)curl_easy_init();
  this->curl_ = pCVar1;
  return;
}

Assistant:

Session(bool throw_exception) : throw_exception_{throw_exception} {
        curl_global_init(CURL_GLOBAL_ALL);
        curl_ = curl_easy_init();
    }